

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.cpp
# Opt level: O0

MPP_RET mpi_control(MppCtx ctx,MpiCmd cmd,MppParam param)

{
  MpiImpl *p;
  MPP_RET ret;
  MppParam param_local;
  MpiCmd cmd_local;
  MppCtx ctx_local;
  
  if ((mpi_debug & 1) != 0) {
    _mpp_log_l(4,"mpi","enter ctx %p cmd %x parm %p\n","mpi_control",ctx,(ulong)cmd,param);
  }
  p._4_4_ = _check_mpp_ctx((MpiImpl *)ctx,"mpi_control");
  if (p._4_4_ == MPP_OK) {
    p._4_4_ = Mpp::control(*(Mpp **)((long)ctx + 0x18),cmd,param);
  }
  if ((mpi_debug & 1) != 0) {
    _mpp_log_l(4,"mpi","leave ctx %p ret %d\n","mpi_control",ctx,(ulong)(uint)p._4_4_);
  }
  return p._4_4_;
}

Assistant:

static MPP_RET mpi_control(MppCtx ctx, MpiCmd cmd, MppParam param)
{
    MPP_RET ret = MPP_NOK;
    MpiImpl *p = (MpiImpl *)ctx;

    mpi_dbg_func("enter ctx %p cmd %x parm %p\n", ctx, cmd, param);
    do {
        ret = check_mpp_ctx(p);
        if (ret)
            break;;

        ret = p->ctx->control(cmd, param);
    } while (0);

    mpi_dbg_func("leave ctx %p ret %d\n", ctx, ret);
    return ret;
}